

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

bam_hdr_t * bam_hdr_read(BGZF *fp)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  bam_hdr_t *data;
  char *data_00;
  char **ppcVar4;
  uint32_t *puVar5;
  void *pvVar6;
  ulong uVar7;
  uint32_t uVar8;
  long lVar9;
  int32_t name_len;
  char buf [4];
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar1 = bgzf_check_EOF(fp);
  if (iVar1 < 0) {
    perror("[W::sam_hdr_read] bgzf_check_EOF");
  }
  else if ((iVar1 == 0) && (1 < hts_verbose)) {
    bam_hdr_read_cold_1();
  }
  sVar3 = bgzf_read(fp,(void *)((long)&local_38 + 4),4);
  if (((int)sVar3 == 4) && (local_38._4_4_ == 0x14d4142)) {
    data = (bam_hdr_t *)calloc(1,0x38);
    puVar5 = &data->l_text;
    bgzf_read(fp,puVar5,4);
    if ((fp->field_0x2 & 0xc) == 0) {
      uVar8 = *puVar5;
    }
    else {
      uVar2 = *puVar5;
      uVar8 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *puVar5 = uVar8;
    }
    data_00 = (char *)malloc((ulong)(uVar8 + 1));
    data->text = data_00;
    data_00[uVar8] = '\0';
    bgzf_read(fp,data_00,(ulong)uVar8);
    bgzf_read(fp,data,4);
    if ((fp->field_0x2 & 0xc) == 0) {
      uVar2 = data->n_targets;
    }
    else {
      uVar2 = data->n_targets;
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      data->n_targets = uVar2;
    }
    ppcVar4 = (char **)calloc((long)(int)uVar2,8);
    data->target_name = ppcVar4;
    puVar5 = (uint32_t *)calloc((long)(int)uVar2,4);
    data->target_len = puVar5;
    if (uVar2 != 0) {
      lVar9 = 0;
      uVar7 = 0;
      do {
        bgzf_read(fp,&local_38,4);
        uVar2 = (uint)local_38;
        if ((fp->field_0x2 & 0xc) != 0) {
          uVar2 = (uint)local_38 >> 0x18 | ((uint)local_38 & 0xff0000) >> 8 |
                  ((uint)local_38 & 0xff00) << 8 | (uint)local_38 << 0x18;
          local_38 = CONCAT44(local_38._4_4_,uVar2);
        }
        pvVar6 = calloc((long)(int)uVar2,1);
        *(void **)((long)data->target_name + lVar9 * 2) = pvVar6;
        bgzf_read(fp,*(void **)((long)data->target_name + lVar9 * 2),(long)(int)uVar2);
        bgzf_read(fp,(void *)((long)data->target_len + lVar9),4);
        if ((fp->field_0x2 & 0xc) != 0) {
          uVar2 = *(uint *)((long)data->target_len + lVar9);
          *(uint *)((long)data->target_len + lVar9) =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        }
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 4;
      } while (uVar7 != (uint)data->n_targets);
    }
  }
  else {
    if (0 < hts_verbose) {
      bam_hdr_read_cold_2();
    }
    data = (bam_hdr_t *)0x0;
  }
  return data;
}

Assistant:

bam_hdr_t *bam_hdr_read(BGZF *fp)
{
    bam_hdr_t *h;
    char buf[4];
    int magic_len, has_EOF;
    int32_t i = 1, name_len;
    // check EOF
    has_EOF = bgzf_check_EOF(fp);
    if (has_EOF < 0) {
        perror("[W::sam_hdr_read] bgzf_check_EOF");
    } else if (has_EOF == 0 && hts_verbose >= 2)
        fprintf(stderr, "[W::%s] EOF marker is absent. The input is probably truncated.\n", __func__);
    // read "BAM1"
    magic_len = bgzf_read(fp, buf, 4);
    if (magic_len != 4 || strncmp(buf, "BAM\1", 4)) {
        if (hts_verbose >= 1) fprintf(stderr, "[E::%s] invalid BAM binary header\n", __func__);
        return 0;
    }
    h = bam_hdr_init();
    // read plain text and the number of reference sequences
    bgzf_read(fp, &h->l_text, 4);
    if (fp->is_be) ed_swap_4p(&h->l_text);
    h->text = (char*)malloc(h->l_text + 1);
    h->text[h->l_text] = 0; // make sure it is NULL terminated
    bgzf_read(fp, h->text, h->l_text);
    bgzf_read(fp, &h->n_targets, 4);
    if (fp->is_be) ed_swap_4p(&h->n_targets);
    // read reference sequence names and lengths
    h->target_name = (char**)calloc(h->n_targets, sizeof(char*));
    h->target_len = (uint32_t*)calloc(h->n_targets, sizeof(uint32_t));
    for (i = 0; i != h->n_targets; ++i) {
        bgzf_read(fp, &name_len, 4);
        if (fp->is_be) ed_swap_4p(&name_len);
        h->target_name[i] = (char*)calloc(name_len, 1);
        bgzf_read(fp, h->target_name[i], name_len);
        bgzf_read(fp, &h->target_len[i], 4);
        if (fp->is_be) ed_swap_4p(&h->target_len[i]);
    }
    return h;
}